

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetColumnEnabled(int column_n,bool enabled)

{
  ImGuiTable *pIVar1;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 != (ImGuiTable *)0x0) {
    if (column_n < 0) {
      column_n = pIVar1->CurrentColumn;
    }
    (pIVar1->Columns).Data[column_n].IsUserEnabledNextFrame = enabled;
  }
  return;
}

Assistant:

void ImGui::TableSetColumnEnabled(int column_n, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL);
    if (!table)
        return;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Hideable); // See comments above
    if (column_n < 0)
        column_n = table->CurrentColumn;
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column = &table->Columns[column_n];
    column->IsUserEnabledNextFrame = enabled;
}